

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.hh
# Opt level: O0

void __thiscall TestCase<true>::~TestCase(TestCase<true> *this)

{
  TestCase<true> *this_local;
  
  (this->super_BaseCase)._vptr_BaseCase = (_func_int **)&PTR_run_00126a28;
  std::__cxx11::string::~string((string *)&this->defined_file_);
  std::__cxx11::string::~string((string *)&this->case_name_);
  std::function<void_()>::~function(&this->method_);
  BaseCase::~BaseCase(&this->super_BaseCase);
  return;
}

Assistant:

~TestCase() override = default;